

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::SelectMakeProgram
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *inMakeProgram,
          string *makeDefault)

{
  cmake *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_69;
  string local_68;
  char *local_48;
  char *makeProgramCSTR;
  undefined1 local_29;
  string *local_28;
  string *makeDefault_local;
  string *inMakeProgram_local;
  cmGlobalGenerator *this_local;
  string *makeProgram;
  
  local_29 = 0;
  local_28 = makeDefault;
  makeDefault_local = inMakeProgram;
  inMakeProgram_local = (string *)this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inMakeProgram);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::IsOff(pcVar2);
  if (bVar1) {
    this_00 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"CMAKE_MAKE_PROGRAM",&local_69);
    pcVar2 = cmake::GetCacheDefinition(this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = pcVar2;
    bVar1 = cmSystemTools::IsOff(pcVar2);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_28);
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_48);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::IsOff(pcVar2);
    if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"CMAKE_MAKE_PROGRAM-NOTFOUND");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::SelectMakeProgram(
                                          const std::string& inMakeProgram,
                                          const std::string& makeDefault) const
{
  std::string makeProgram = inMakeProgram;
  if(cmSystemTools::IsOff(makeProgram.c_str()))
    {
    const char* makeProgramCSTR =
      this->CMakeInstance->GetCacheDefinition("CMAKE_MAKE_PROGRAM");
    if(cmSystemTools::IsOff(makeProgramCSTR))
      {
      makeProgram = makeDefault;
      }
    else
      {
      makeProgram = makeProgramCSTR;
      }
    if(cmSystemTools::IsOff(makeProgram.c_str()) &&
       !makeProgram.empty())
      {
      makeProgram = "CMAKE_MAKE_PROGRAM-NOTFOUND";
      }
    }
  return makeProgram;
}